

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O3

void debug(int level,char *file,int line,string *msg)

{
  ostream *poVar1;
  size_t sVar2;
  char *pcVar3;
  string level_head;
  char *local_48;
  long local_40;
  char local_38 [16];
  
  local_40 = 0;
  local_38[0] = '\0';
  local_48 = local_38;
  if (level == 1) {
    pcVar3 = "\x1b[31m[error]\x1b[0m ";
LAB_0011309c:
    std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)0x0,(ulong)pcVar3);
  }
  else {
    if (level == 2) {
      pcVar3 = "\x1b[33m[warn]\x1b[0m ";
      goto LAB_0011309c;
    }
    if (level == 4) {
      pcVar3 = "\x1b[32m[info]\x1b[0m ";
      goto LAB_0011309c;
    }
    std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)0x0,0x116c8a);
    if ((level & 7U) == 0) goto LAB_00113165;
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_48,local_40);
  if (file == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(file);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,file,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(msg->_M_dataplus)._M_p,msg->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
LAB_00113165:
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return;
}

Assistant:

void debug(const int level, const char *file, int line, std::string msg) {
    std::string level_head;
    switch (level) {
        case INFO_FLAG:level_head = "\033[32m[info]\033[0m ";
            break;
        case WARN_FLAG:level_head = "\033[33m[warn]\033[0m ";
            break;
        case ERR_FLAG:level_head = "\033[31m[error]\033[0m ";
            break;
        default:level_head = "[unknow]";
            break;
    }

    if (level & DEBUG) {
        std::cout << level_head << file << ":" << line << ": " << msg
                  << std::endl;
    }
}